

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

int __thiscall Polynomial::createNotNode(Polynomial *this,int first_loc)

{
  int iVar1;
  iterator __position;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> args;
  allocator_type local_51;
  operand local_50;
  vector<int,_std::allocator<int>_> local_30;
  
  this->mResultLocation =
       (int)((ulong)((long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 2);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_50;
  local_50.op = first_loc;
  std::vector<int,_std::allocator<int>_>::vector(&local_30,__l,&local_51);
  local_50.op = NOT;
  std::vector<int,_std::allocator<int>_>::vector(&local_50.args,&local_30);
  std::vector<Polynomial::operand,_std::allocator<Polynomial::operand>_>::
  emplace_back<Polynomial::operand>(&this->mOperands,&local_50);
  if (local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.args.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_50.op = PLUS;
  __position._M_current =
       (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&this->mEvaluationValues,__position,(int *)&local_50);
  }
  else {
    *__position._M_current = 0;
    (this->mEvaluationValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  iVar1 = this->mResultLocation;
  if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar1;
}

Assistant:

int Polynomial::createNotNode(int first_loc)
{
  mResultLocation = mEvaluationValues.size();
  std::vector<int> args { first_loc };
  mOperands.push_back({operandType::NOT, args});
  mEvaluationValues.push_back(0); // make space in evaluation array for the output.
  return mResultLocation;
}